

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geomCallback(sqlite3_context *ctx,int nArg,sqlite3_value **aArg)

{
  int n;
  sqlite3_context *pCtx;
  undefined4 *z;
  int in_ESI;
  sqlite3_context *in_RDI;
  double dVar1;
  int i;
  int nBlob;
  RtreeMatchArg *pBlob;
  RtreeGeomCallback *pGeomCtx;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_30;
  
  pCtx = (sqlite3_context *)sqlite3_user_data(in_RDI);
  n = (in_ESI + -1) * 8 + 0x38;
  z = (undefined4 *)sqlite3_malloc(in_stack_ffffffffffffffcc);
  if (z == (undefined4 *)0x0) {
    sqlite3_result_error_nomem((sqlite3_context *)0x122856);
  }
  else {
    *z = 0x891245ab;
    *(Mem **)(z + 2) = pCtx->pOut;
    *(FuncDef **)(z + 4) = pCtx->pFunc;
    *(Mem **)(z + 6) = pCtx->pMem;
    *(Vdbe **)(z + 8) = pCtx->pVdbe;
    z[10] = in_ESI;
    for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
      dVar1 = sqlite3_value_double((sqlite3_value *)0x1228c0);
      *(double *)(z + (long)local_30 * 2 + 0xc) = dVar1;
    }
    sqlite3_result_blob(pCtx,z,n,(_func_void_void_ptr *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static void geomCallback(sqlite3_context *ctx, int nArg, sqlite3_value **aArg){
  RtreeGeomCallback *pGeomCtx = (RtreeGeomCallback *)sqlite3_user_data(ctx);
  RtreeMatchArg *pBlob;
  int nBlob;

  nBlob = sizeof(RtreeMatchArg) + (nArg-1)*sizeof(RtreeDValue);
  pBlob = (RtreeMatchArg *)sqlite3_malloc(nBlob);
  if( !pBlob ){
    sqlite3_result_error_nomem(ctx);
  }else{
    int i;
    pBlob->magic = RTREE_GEOMETRY_MAGIC;
    pBlob->cb = pGeomCtx[0];
    pBlob->nParam = nArg;
    for(i=0; i<nArg; i++){
#ifdef SQLITE_RTREE_INT_ONLY
      pBlob->aParam[i] = sqlite3_value_int64(aArg[i]);
#else
      pBlob->aParam[i] = sqlite3_value_double(aArg[i]);
#endif
    }
    sqlite3_result_blob(ctx, pBlob, nBlob, sqlite3_free);
  }
}